

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_ControlCharacterUTF16_Test::TestBody(JsonString_ControlCharacterUTF16_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  Message *pMVar2;
  char *pcVar3;
  error_code *this_03;
  extensions extensions;
  char *in_R9;
  AssertHelper local_1b8;
  Message local_1b0;
  coord local_1a8;
  coord local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_30;
  JsonString_ControlCharacterUTF16_Test *local_10;
  JsonString_ControlCharacterUTF16_Test *this_local;
  
  local_10 = this;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_48,"\t");
  mock_json_callbacks::gmock_string_value
            (&local_30,&(this->super_JsonString).callbacks_.super_mock_json_callbacks,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_30,(WithoutMatchers *)((long)&p.coordinate_.column + 3),(void *)0x0)
  ;
  extensions = 0x1effd7;
  this_01 = testing::internal::
            MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
                       ,0xc2,"callbacks_","string_value (\"\\t\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_01,1);
  testing::internal::
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_30);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_,
             (json *)&(this->super_JsonString).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_,
                       "\"\\u0009\"");
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  local_109 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_);
  local_109 = !local_109;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pMVar2 = testing::Message::operator<<(&local_118,(char (*) [30])"Expected the parse to succeed")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_108,
               (AssertionResult *)"p.has_error ()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  this_03 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_);
  local_151 = std::error_code::operator_cast_to_bool(this_03);
  local_151 = !local_151;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pMVar2 = testing::Message::operator<<
                       (&local_160,(char (*) [36])"Expected the parse error to be zero");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_150,
               (AssertionResult *)"p.last_error ()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1a0 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::coordinate
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_);
  pstore::json::coord::coord(&local_1a8,9,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_198,"p.coordinate ()","(json::coord{9U, 1U})",&local_1a0,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F (JsonString, ControlCharacterUTF16) {
    EXPECT_CALL (callbacks_, string_value ("\t")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input (R"("\u0009")").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}